

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

bool vkt::pipeline::multisample::checkForErrorRS
               (VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS,deUint32 errorCompNdx)

{
  uint *puVar1;
  undefined1 local_44 [24];
  deUint32 errorComponent;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  deUint32 errorCompNdx_local;
  ConstPixelBufferAccess *dataRS_local;
  VkImageCreateInfo *imageRSInfo_local;
  
  x = 0;
  y = errorCompNdx;
  _z = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)imageRSInfo;
  do {
    if (*(uint *)((long)&dataRS_local->m_data + 4) <= x) {
      return false;
    }
    for (errorComponent = 0; errorComponent < *(uint *)&dataRS_local->m_data;
        errorComponent = errorComponent + 1) {
      for (local_44._20_4_ = 0; (uint)local_44._20_4_ < (uint)(dataRS_local->m_pitch).m_data[2];
          local_44._20_4_ = local_44._20_4_ + 1) {
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_44,(int)_z,local_44._20_4_,errorComponent);
        puVar1 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_44,y);
        if (*puVar1 != 0) {
          return true;
        }
        local_44._16_4_ = 0;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool checkForErrorRS (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS, const deUint32 errorCompNdx)
{
	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z)[errorCompNdx];

		if (errorComponent > 0)
			return true;
	}

	return false;
}